

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_0::RandomGroup::init(RandomGroup *this,EVP_PKEY_CTX *ctx)

{
  _Rb_tree_header *p_Var1;
  TestContext *testCtx;
  RenderContext *pRVar2;
  _Base_ptr p_Var3;
  _Rb_tree_color _Var4;
  DrawTest *pDVar5;
  long *name;
  undefined4 uVar6;
  bool bVar7;
  bool bVar8;
  int i;
  int iVar9;
  deUint32 dVar10;
  deBool dVar11;
  int iVar12;
  CompatibilityTestType CVar13;
  uint uVar14;
  int extraout_EAX;
  long lVar15;
  ulong uVar16;
  _Base_ptr p_Var17;
  _Rb_tree_header *p_Var18;
  deUint32 hash;
  DrawTestSpec spec;
  DrawMethod drawMethods [2];
  IndexType indexTypes [3];
  int indirectOffsets [3];
  int firsts [3];
  int indexOffsets [3];
  int primitiveCounts [3];
  int attribCounts [3];
  float indirectOffsetWeigths [3];
  float firstWeights [3];
  float indexOffsetWeights [3];
  float primitiveCountWeights [3];
  float attribWeights [3];
  UniformWeightArray<2> drawMethodWeights;
  int baseVertices [5];
  int instanceDivisors [4];
  int strides [4];
  int offsets [4];
  float indexWeights [4];
  int indexMaxs [4];
  int indexMins [4];
  int instanceCounts [4];
  UniformWeightArray<3> indexTypeWeights;
  float baseVertexWeigths [5];
  Primitive primitives [7];
  Usage usages [9];
  float instanceDivisorWeights [4];
  float strideWeights [4];
  float offsetWeights [4];
  float instanceWeights [4];
  InputType inputTypes [11];
  OutputType outputTypes [12];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> insertedHashes;
  AttributeSpec attribSpec;
  UniformWeightArray<7> primitiveWeights;
  Random random;
  UniformWeightArray<9> usageWeights;
  UniformWeightArray<11> inputTypeWeights;
  UniformWeightArray<12> outputTypeWeights;
  _Rb_tree_color local_594;
  DrawTest *local_590;
  undefined1 local_588 [56];
  pointer local_550;
  iterator local_548;
  AttributeSpec *local_540;
  TestNode *local_538;
  long local_530;
  DrawMethod local_528 [2];
  IndexType local_520 [4];
  int local_510 [4];
  int local_500 [4];
  int local_4f0 [4];
  int local_4e0 [4];
  int local_4d0 [4];
  RenderContext *local_4c0;
  ulong local_4b8;
  long *local_4b0;
  long local_4a0 [2];
  float local_490 [4];
  float local_480 [4];
  float local_470 [4];
  float local_460 [4];
  float local_450 [4];
  float local_440 [2];
  int local_438 [8];
  int local_418 [12];
  float local_3e8 [4];
  int local_3d8 [13];
  float local_3a4 [5];
  undefined1 *puStack_390;
  undefined4 local_388;
  Primitive local_378 [5];
  undefined1 *puStack_364;
  Primitive local_35c;
  Usage local_358 [12];
  float local_328 [16];
  InputType local_2e8 [4];
  undefined1 *puStack_2d8;
  undefined4 uStack_2d0;
  undefined4 local_2cc;
  undefined4 uStack_2c8;
  undefined8 uStack_2c4;
  InputType local_2bc;
  OutputType local_2b8 [12];
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_288;
  undefined1 local_258 [28];
  bool bStack_23c;
  undefined3 uStack_23b;
  int local_238;
  bool bStack_234;
  undefined3 uStack_233;
  ios_base local_1e8 [268];
  float local_dc [7];
  deRandom local_c0;
  float local_b0 [9];
  float local_8c [11];
  float local_60 [12];
  
  local_4d0[0] = 1;
  local_4d0[1] = 2;
  local_4d0[2] = 5;
  local_450[2] = 1.0;
  local_450[0] = 30.0;
  local_450[1] = 10.0;
  local_4e0[0] = 1;
  local_4e0[1] = 5;
  local_4e0[2] = 0x40;
  local_460[2] = 1.0;
  local_460[0] = 20.0;
  local_460[1] = 10.0;
  local_4f0[2] = 0xd;
  local_4f0[0] = 0;
  local_4f0[1] = 7;
  local_470[2] = 1.0;
  local_470[0] = 20.0;
  local_470[1] = 20.0;
  local_500[2] = 0xd;
  local_500[0] = 0;
  local_500[1] = 7;
  local_480[2] = 1.0;
  local_480[0] = 20.0;
  local_480[1] = 20.0;
  local_3d8[8] = 1;
  local_3d8[9] = 2;
  local_3d8[10] = 0x10;
  local_3d8[0xb] = 0x11;
  local_328[0xc] = 20.0;
  local_328[0xd] = 10.0;
  local_328[0xe] = 5.0;
  local_328[0xf] = 1.0;
  local_3d8[4] = 0;
  local_3d8[5] = 1;
  local_3d8[6] = 3;
  local_3d8[7] = 8;
  local_3d8[0] = 4;
  local_3d8[1] = 8;
  local_3d8[2] = 0x80;
  local_3d8[3] = 0x101;
  local_3e8[0] = 50.0;
  local_3e8[1] = 50.0;
  local_3e8[2] = 50.0;
  local_3e8[3] = 50.0;
  local_418[8] = 0;
  local_418[9] = 1;
  local_418[10] = 5;
  local_418[0xb] = 0xc;
  local_328[8] = 50.0;
  local_328[9] = 10.0;
  local_328[10] = 10.0;
  local_328[0xb] = 10.0;
  local_418[4] = 0;
  local_418[5] = 7;
  local_418[6] = 0x10;
  local_418[7] = 0x11;
  local_328[4] = 50.0;
  local_328[5] = 10.0;
  local_328[6] = 10.0;
  local_328[7] = 10.0;
  local_418[0] = 0;
  local_418[1] = 1;
  local_418[2] = 3;
  local_418[3] = 0x81;
  local_328[0] = 70.0;
  local_328[1] = 30.0;
  local_328[2] = 10.0;
  local_328[3] = 10.0;
  local_510[0] = 0;
  local_510[1] = 1;
  local_510[2] = 2;
  local_490[2] = 1.0;
  local_490[0] = 2.0;
  local_490[1] = 1.0;
  local_438[0] = 0;
  local_438[1] = 1;
  local_438[2] = -2;
  local_438[3] = 4;
  local_438[4] = 3;
  local_388 = 0x3f800000;
  local_3a4[3] = 4.0;
  local_3a4[4] = 1.0;
  puStack_390 = &DAT_3f8000003f800000;
  local_378[4] = 4;
  puStack_364 = &DAT_600000005;
  local_378[0] = PRIMITIVE_POINTS;
  local_378[1] = PRIMITIVE_TRIANGLES;
  local_378[2] = 2;
  local_378[3] = 3;
  lVar15 = 0;
  do {
    local_dc[lVar15] = 1.0;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 7);
  local_528[0] = DRAWMETHOD_DRAWARRAYS_INDIRECT;
  local_528[1] = DRAWMETHOD_DRAWELEMENTS_INDIRECT;
  lVar15 = 0;
  do {
    local_440[lVar15] = 1.0;
    lVar15 = lVar15 + 1;
  } while (lVar15 == 1);
  local_520[0] = INDEXTYPE_BYTE;
  local_520[1] = INDEXTYPE_SHORT;
  local_520[2] = 2;
  lVar15 = 0;
  do {
    local_3a4[lVar15] = 1.0;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  uStack_2c8 = 9;
  uStack_2c4 = 0xb0000000a;
  puStack_2d8 = &DAT_600000005;
  uStack_2d0 = 7;
  local_2cc = 8;
  local_2e8[0] = INPUTTYPE_FLOAT;
  local_2e8[1] = INPUTTYPE_FIXED;
  local_2e8[2] = INPUTTYPE_BYTE;
  local_2e8[3] = INPUTTYPE_SHORT;
  lVar15 = 0;
  do {
    local_8c[lVar15] = 1.0;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0xb);
  local_2b8[8] = OUTPUTTYPE_IVEC4;
  local_2b8[9] = OUTPUTTYPE_UVEC2;
  local_2b8[10] = OUTPUTTYPE_UVEC3;
  local_2b8[0xb] = OUTPUTTYPE_UVEC4;
  local_2b8[4] = OUTPUTTYPE_INT;
  local_2b8[5] = OUTPUTTYPE_UINT;
  local_2b8[6] = OUTPUTTYPE_IVEC2;
  local_2b8[7] = OUTPUTTYPE_IVEC3;
  local_2b8[0] = OUTPUTTYPE_FLOAT;
  local_2b8[1] = OUTPUTTYPE_VEC2;
  local_2b8[2] = OUTPUTTYPE_VEC3;
  local_2b8[3] = OUTPUTTYPE_VEC4;
  lVar15 = 0;
  do {
    local_60[lVar15] = 1.0;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0xc);
  local_358[4] = USAGE_STREAM_COPY;
  local_358[5] = USAGE_STATIC_READ;
  local_358[6] = USAGE_STATIC_COPY;
  local_358[7] = USAGE_DYNAMIC_READ;
  local_358[0] = USAGE_DYNAMIC_DRAW;
  local_358[1] = USAGE_STATIC_DRAW;
  local_358[2] = USAGE_STREAM_DRAW;
  local_358[3] = USAGE_STREAM_READ;
  local_358[8] = 8;
  lVar15 = 0;
  do {
    local_b0[lVar15] = 1.0;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 9);
  p_Var1 = &local_288._M_impl.super__Rb_tree_header;
  local_288._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar16 = 0;
  local_288._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_288._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_530 = 0;
  local_538 = (TestNode *)this;
  local_288._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_288._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  do {
    local_4b8 = uVar16;
    deRandom_init(&local_c0,(int)uVar16 + 0xc551393);
    iVar9 = de::Random::chooseWeighted<int,int_const*,float_const*>
                      ((Random *)&local_c0,local_4d0,local_4d0 + 3,local_450);
    deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_588);
    local_588._0_4_ = 0x13;
    local_588._4_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::Primitive,deqp::gls::DrawTestSpec::Primitive*,float_const*>
                   ((Random *)&local_c0,local_378,&local_35c,local_dc);
    local_588._8_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_c0,local_4e0,local_4e0 + 3,local_460);
    local_588._12_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::DrawMethod,deqp::gls::DrawTestSpec::DrawMethod*,float_const*>
                   ((Random *)&local_c0,local_528,local_520,local_440);
    if (local_588._12_4_ == DRAWMETHOD_DRAWARRAYS_INDIRECT) {
      iVar12 = 0x10;
LAB_013ed56c:
      local_588._16_4_ =
           de::Random::
           chooseWeighted<deqp::gls::DrawTestSpec::IndexType,deqp::gls::DrawTestSpec::IndexType*,float_const*>
                     ((Random *)&local_c0,local_520,local_520 + 3,local_3a4);
      local_588._20_4_ =
           de::Random::chooseWeighted<int,int_const*,float_const*>
                     ((Random *)&local_c0,local_4f0,local_4f0 + 3,local_470);
      local_588._24_4_ = STORAGE_BUFFER;
      local_588._28_4_ =
           de::Random::chooseWeighted<int,int_const*,float_const*>
                     ((Random *)&local_c0,local_500,local_500 + 3,local_480);
      local_588._32_4_ =
           de::Random::chooseWeighted<int,int_const*,float_const*>
                     ((Random *)&local_c0,local_3d8 + 4,local_3d8 + 8,local_3e8);
      local_588._36_4_ =
           de::Random::chooseWeighted<int,int_const*,float_const*>
                     ((Random *)&local_c0,local_3d8,local_3d8 + 4,local_3e8);
      local_588._40_4_ =
           de::Random::chooseWeighted<int,int_const*,float_const*>
                     ((Random *)&local_c0,local_3d8 + 8,local_3d8 + 0xc,local_328 + 0xc);
      local_588._44_4_ =
           de::Random::chooseWeighted<int,int_const*,float_const*>
                     ((Random *)&local_c0,local_510,local_510 + 3,local_490);
      local_588._44_4_ = local_588._44_4_ * iVar12;
      local_588._48_4_ =
           de::Random::chooseWeighted<int,int_const*,float_const*>
                     ((Random *)&local_c0,local_438,local_438 + 5,local_3a4 + 3);
      bVar7 = deqp::gls::DrawTestSpec::valid((DrawTestSpec *)local_588);
      bVar8 = false;
      if (bVar7) {
        local_590 = (DrawTest *)CONCAT44(local_590._4_4_,iVar9);
        if (0 < iVar9) {
          iVar9 = 0;
          do {
            deqp::gls::DrawTestSpec::AttributeSpec::AttributeSpec((AttributeSpec *)local_258);
            local_258._0_4_ =
                 de::Random::
                 chooseWeighted<deqp::gls::DrawTestSpec::InputType,deqp::gls::DrawTestSpec::InputType*,float_const*>
                           ((Random *)&local_c0,local_2e8,&local_2bc,local_8c);
            local_258._4_4_ =
                 de::Random::
                 chooseWeighted<deqp::gls::DrawTestSpec::OutputType,deqp::gls::DrawTestSpec::OutputType*,float_const*>
                           ((Random *)&local_c0,local_2b8,(OutputType *)&local_288,local_60);
            local_258._8_4_ = STORAGE_BUFFER;
            local_258._12_4_ =
                 de::Random::
                 chooseWeighted<deqp::gls::DrawTestSpec::Usage,deqp::gls::DrawTestSpec::Usage*,float_const*>
                           ((Random *)&local_c0,local_358,local_358 + 9,local_b0);
            dVar10 = deRandom_getUint32(&local_c0);
            local_258._16_4_ = (dVar10 & 3) + 1;
            local_258._20_4_ =
                 de::Random::chooseWeighted<int,int_const*,float_const*>
                           ((Random *)&local_c0,local_418 + 8,(int *)local_3e8,local_328 + 8);
            local_258._24_4_ =
                 de::Random::chooseWeighted<int,int_const*,float_const*>
                           ((Random *)&local_c0,local_418 + 4,local_418 + 8,local_328 + 4);
            dVar11 = deRandom_getBool(&local_c0);
            bStack_23c = dVar11 == 1;
            local_238 = de::Random::chooseWeighted<int,int_const*,float_const*>
                                  ((Random *)&local_c0,local_418,local_418 + 4,local_328);
            dVar11 = deRandom_getBool(&local_c0);
            bStack_234 = dVar11 == 1;
            bVar8 = deqp::gls::DrawTestSpec::AttributeSpec::valid
                              ((AttributeSpec *)local_258,(ApiType)local_588._0_4_);
            uVar6 = local_258._16_4_;
            if (local_258._24_4_ != 0) {
              iVar12 = deqp::gls::DrawTestSpec::inputTypeSize(local_258._0_4_);
              bVar8 = bVar8 && iVar12 * uVar6 <= (int)local_258._24_4_;
            }
            if (bVar8 != false) {
              if (local_548._M_current == local_540) {
                std::
                vector<deqp::gls::DrawTestSpec::AttributeSpec,std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>>
                ::_M_realloc_insert<deqp::gls::DrawTestSpec::AttributeSpec_const&>
                          ((vector<deqp::gls::DrawTestSpec::AttributeSpec,std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>>
                            *)&local_550,local_548,(AttributeSpec *)local_258);
              }
              else {
                (local_548._M_current)->instanceDivisor = local_238;
                (local_548._M_current)->useDefaultAttribute = (bool)(char)_bStack_234;
                (local_548._M_current)->additionalPositionAttribute = (bool)SUB41(_bStack_234,1);
                (local_548._M_current)->bgraComponentOrder = (bool)SUB41(_bStack_234,2);
                (local_548._M_current)->field_0x27 = SUB41(_bStack_234,3);
                (local_548._M_current)->componentCount = local_258._16_4_;
                (local_548._M_current)->offset = local_258._20_4_;
                (local_548._M_current)->stride = local_258._24_4_;
                (local_548._M_current)->normalize = (bool)(char)_bStack_23c;
                *(int3 *)&(local_548._M_current)->field_0x1d = (int3)((uint)_bStack_23c >> 8);
                (local_548._M_current)->inputType = local_258._0_4_;
                (local_548._M_current)->outputType = local_258._4_4_;
                (local_548._M_current)->storage = local_258._8_4_;
                (local_548._M_current)->usage = local_258._12_4_;
                local_548._M_current = local_548._M_current + 1;
              }
              iVar9 = iVar9 + 1;
            }
          } while (iVar9 < (int)local_590);
        }
        pDVar5 = local_590;
        if (local_588._4_4_ != PRIMITIVE_POINTS) {
          local_550->instanceDivisor = 0;
        }
        iVar9 = (int)local_590;
        if (((((local_588._12_4_ == DRAWMETHOD_DRAWELEMENTS_RANGED) &&
              (local_588._4_4_ != PRIMITIVE_POINTS)) && (local_588._32_4_ == local_588._36_4_)) ||
            ((local_588._4_4_ != PRIMITIVE_POINTS && (local_550->useDefaultAttribute != false)))) ||
           ((local_588._4_4_ - PRIMITIVE_TRIANGLES < 3 &&
            (((local_550->componentCount == 1 ||
              ((local_550->outputType < OUTPUTTYPE_IVEC2 &&
               ((0x31U >> (local_550->outputType & 0x1f) & 1) != 0)))) ||
             ((local_588._12_4_ == DRAWMETHOD_DRAWELEMENTS_RANGED &&
              ((int)(local_588._36_4_ - local_588._32_4_) < 2)))))))) {
          bVar8 = false;
        }
        else {
          local_594 = deqp::gls::DrawTestSpec::hash((DrawTestSpec *)local_588);
          p_Var17 = &p_Var1->_M_header;
          p_Var3 = local_288._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (0 < iVar9) {
            lVar15 = 0;
            do {
              _Var4 = local_594;
              local_594 = deqp::gls::DrawTestSpec::AttributeSpec::hash
                                    ((AttributeSpec *)((long)&local_550->inputType + lVar15));
              local_594 = local_594 ^ _Var4 << 2;
              lVar15 = lVar15 + 0x28;
              p_Var3 = local_288._M_impl.super__Rb_tree_header._M_header._M_parent;
            } while (((ulong)pDVar5 & 0xffffffff) * 0x28 != lVar15);
          }
          for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
              p_Var3 = (&p_Var3->_M_left)[bVar8]) {
            bVar8 = (_Rb_tree_color)*(size_t *)(p_Var3 + 1) < local_594;
            if (!bVar8) {
              p_Var17 = p_Var3;
            }
          }
          p_Var18 = p_Var1;
          if (((_Rb_tree_header *)p_Var17 != p_Var1) &&
             (p_Var18 = (_Rb_tree_header *)p_Var17,
             local_594 < (_Rb_tree_color)((_Rb_tree_header *)p_Var17)->_M_node_count)) {
            p_Var18 = p_Var1;
          }
          if (p_Var18 == p_Var1) {
            CVar13 = deqp::gls::DrawTestSpec::isCompatibilityTest((DrawTestSpec *)local_588);
            if ((CVar13 != COMPATIBILITY_UNALIGNED_OFFSET) &&
               (CVar13 = deqp::gls::DrawTestSpec::isCompatibilityTest((DrawTestSpec *)local_588),
               CVar13 != COMPATIBILITY_UNALIGNED_STRIDE)) {
              local_590 = (DrawTest *)operator_new(0x138);
              testCtx = local_538->m_testCtx;
              pRVar2 = ((Context *)local_538[1]._vptr_TestNode)->m_renderCtx;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_258);
              local_4c0 = pRVar2;
              std::ostream::_M_insert<unsigned_long>((ulong)local_258);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_258);
              std::ios_base::~ios_base(local_1e8);
              name = local_4b0;
              deqp::gls::DrawTestSpec::getDesc_abi_cxx11_
                        ((string *)local_258,(DrawTestSpec *)local_588);
              pDVar5 = local_590;
              deqp::gls::DrawTest::DrawTest
                        (local_590,testCtx,local_4c0,(DrawTestSpec *)local_588,(char *)name,
                         (char *)CONCAT44(local_258._4_4_,local_258._0_4_));
              tcu::TestNode::addChild(local_538,(TestNode *)pDVar5);
              if ((undefined1 *)CONCAT44(local_258._4_4_,local_258._0_4_) != local_258 + 0x10) {
                operator_delete((undefined1 *)CONCAT44(local_258._4_4_,local_258._0_4_),
                                CONCAT44(local_258._20_4_,local_258._16_4_) + 1);
              }
              if (local_4b0 != local_4a0) {
                operator_delete(local_4b0,local_4a0[0] + 1);
              }
            }
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)&local_288,&local_594);
            local_530 = local_530 + 1;
          }
          bVar8 = false;
        }
      }
    }
    else {
      bVar8 = true;
      if (local_588._12_4_ == DRAWMETHOD_DRAWELEMENTS_INDIRECT) {
        iVar12 = 0x14;
        goto LAB_013ed56c;
      }
    }
    if (local_550 != (pointer)0x0) {
      operator_delete(local_550,(long)local_540 - (long)local_550);
    }
    if ((bVar8) || (uVar14 = (int)local_4b8 + 1, uVar16 = (ulong)uVar14, uVar14 == 100)) {
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_288);
      return extraout_EAX;
    }
  } while( true );
}

Assistant:

void RandomGroup::init (void)
{
	const int	numAttempts				= 100;

	const int	attribCounts[]			= { 1,   2,   5 };
	const float	attribWeights[]			= { 30, 10,   1 };
	const int	primitiveCounts[]		= { 1,   5,  64 };
	const float	primitiveCountWeights[]	= { 20, 10,   1 };
	const int	indexOffsets[]			= { 0,   7,  13 };
	const float	indexOffsetWeights[]	= { 20, 20,   1 };
	const int	firsts[]				= { 0,   7,  13 };
	const float	firstWeights[]			= { 20, 20,   1 };

	const int	instanceCounts[]		= { 1,   2,  16,  17 };
	const float	instanceWeights[]		= { 20, 10,   5,   1 };
	const int	indexMins[]				= { 0,   1,   3,   8 };
	const int	indexMaxs[]				= { 4,   8, 128, 257 };
	const float	indexWeights[]			= { 50, 50,  50,  50 };
	const int	offsets[]				= { 0,   1,   5,  12 };
	const float	offsetWeights[]			= { 50, 10,  10,  10 };
	const int	strides[]				= { 0,   7,  16,  17 };
	const float	strideWeights[]			= { 50, 10,  10,  10 };
	const int	instanceDivisors[]		= { 0,   1,   3, 129 };
	const float	instanceDivisorWeights[]= { 70, 30,  10,  10 };

	const int	indirectOffsets[]		= { 0,   1,   2 };
	const float indirectOffsetWeigths[]	= { 2,   1,   1 };
	const int	baseVertices[]			= { 0,   1,  -2,   4,  3 };
	const float baseVertexWeigths[]		= { 4,   1,   1,   1,  1 };

	gls::DrawTestSpec::Primitive primitives[] =
	{
		gls::DrawTestSpec::PRIMITIVE_POINTS,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLES,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINES,
		gls::DrawTestSpec::PRIMITIVE_LINE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINE_LOOP
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(primitives)> primitiveWeights;

	gls::DrawTestSpec::DrawMethod drawMethods[] =
	{
		gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INDIRECT,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INDIRECT,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(drawMethods)> drawMethodWeights;

	gls::DrawTestSpec::IndexType indexTypes[] =
	{
		gls::DrawTestSpec::INDEXTYPE_BYTE,
		gls::DrawTestSpec::INDEXTYPE_SHORT,
		gls::DrawTestSpec::INDEXTYPE_INT,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(indexTypes)> indexTypeWeights;

	gls::DrawTestSpec::InputType inputTypes[] =
	{
		gls::DrawTestSpec::INPUTTYPE_FLOAT,
		gls::DrawTestSpec::INPUTTYPE_FIXED,
		gls::DrawTestSpec::INPUTTYPE_BYTE,
		gls::DrawTestSpec::INPUTTYPE_SHORT,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_BYTE,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_SHORT,
		gls::DrawTestSpec::INPUTTYPE_INT,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT,
		gls::DrawTestSpec::INPUTTYPE_HALF,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10,
		gls::DrawTestSpec::INPUTTYPE_INT_2_10_10_10,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(inputTypes)> inputTypeWeights;

	gls::DrawTestSpec::OutputType outputTypes[] =
	{
		gls::DrawTestSpec::OUTPUTTYPE_FLOAT,
		gls::DrawTestSpec::OUTPUTTYPE_VEC2,
		gls::DrawTestSpec::OUTPUTTYPE_VEC3,
		gls::DrawTestSpec::OUTPUTTYPE_VEC4,
		gls::DrawTestSpec::OUTPUTTYPE_INT,
		gls::DrawTestSpec::OUTPUTTYPE_UINT,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC2,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC3,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC4,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC2,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC3,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC4,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(outputTypes)> outputTypeWeights;

	gls::DrawTestSpec::Usage usages[] =
	{
		gls::DrawTestSpec::USAGE_DYNAMIC_DRAW,
		gls::DrawTestSpec::USAGE_STATIC_DRAW,
		gls::DrawTestSpec::USAGE_STREAM_DRAW,
		gls::DrawTestSpec::USAGE_STREAM_READ,
		gls::DrawTestSpec::USAGE_STREAM_COPY,
		gls::DrawTestSpec::USAGE_STATIC_READ,
		gls::DrawTestSpec::USAGE_STATIC_COPY,
		gls::DrawTestSpec::USAGE_DYNAMIC_READ,
		gls::DrawTestSpec::USAGE_DYNAMIC_COPY,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(usages)> usageWeights;

	std::set<deUint32>	insertedHashes;
	size_t				insertedCount = 0;

	for (int ndx = 0; ndx < numAttempts; ++ndx)
	{
		de::Random random(0xc551393 + ndx); // random does not depend on previous cases

		int					attributeCount = random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(attribCounts), DE_ARRAY_END(attribCounts), attribWeights);
		int					drawCommandSize;
		gls::DrawTestSpec	spec;

		spec.apiType				= glu::ApiType::es(3,1);
		spec.primitive				= random.chooseWeighted<gls::DrawTestSpec::Primitive>	(DE_ARRAY_BEGIN(primitives),		DE_ARRAY_END(primitives),		primitiveWeights.weights);
		spec.primitiveCount			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(primitiveCounts),	DE_ARRAY_END(primitiveCounts),	primitiveCountWeights);
		spec.drawMethod				= random.chooseWeighted<gls::DrawTestSpec::DrawMethod>	(DE_ARRAY_BEGIN(drawMethods),		DE_ARRAY_END(drawMethods),		drawMethodWeights.weights);

		if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INDIRECT)
			drawCommandSize = sizeof(deUint32[4]);
		else if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INDIRECT)
			drawCommandSize = sizeof(deUint32[5]);
		else
		{
			DE_ASSERT(DE_FALSE);
			return;
		}

		spec.indexType				= random.chooseWeighted<gls::DrawTestSpec::IndexType>	(DE_ARRAY_BEGIN(indexTypes),		DE_ARRAY_END(indexTypes),		indexTypeWeights.weights);
		spec.indexPointerOffset		= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexOffsets),		DE_ARRAY_END(indexOffsets),		indexOffsetWeights);
		spec.indexStorage			= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.first					= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(firsts),			DE_ARRAY_END(firsts),			firstWeights);
		spec.indexMin				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexMins),			DE_ARRAY_END(indexMins),		indexWeights);
		spec.indexMax				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexMaxs),			DE_ARRAY_END(indexMaxs),		indexWeights);
		spec.instanceCount			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(instanceCounts),	DE_ARRAY_END(instanceCounts),	instanceWeights);
		spec.indirectOffset			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indirectOffsets),	DE_ARRAY_END(indirectOffsets),	indirectOffsetWeigths) * drawCommandSize;
		spec.baseVertex				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(baseVertices),		DE_ARRAY_END(baseVertices),		baseVertexWeigths);

		// check spec is legal
		if (!spec.valid())
			continue;

		for (int attrNdx = 0; attrNdx < attributeCount;)
		{
			bool valid;
			gls::DrawTestSpec::AttributeSpec attribSpec;

			attribSpec.inputType			= random.chooseWeighted<gls::DrawTestSpec::InputType>	(DE_ARRAY_BEGIN(inputTypes),		DE_ARRAY_END(inputTypes),		inputTypeWeights.weights);
			attribSpec.outputType			= random.chooseWeighted<gls::DrawTestSpec::OutputType>	(DE_ARRAY_BEGIN(outputTypes),		DE_ARRAY_END(outputTypes),		outputTypeWeights.weights);
			attribSpec.storage				= gls::DrawTestSpec::STORAGE_BUFFER;
			attribSpec.usage				= random.chooseWeighted<gls::DrawTestSpec::Usage>		(DE_ARRAY_BEGIN(usages),			DE_ARRAY_END(usages),			usageWeights.weights);
			attribSpec.componentCount		= random.getInt(1, 4);
			attribSpec.offset				= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(offsets), DE_ARRAY_END(offsets), offsetWeights);
			attribSpec.stride				= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(strides), DE_ARRAY_END(strides), strideWeights);
			attribSpec.normalize			= random.getBool();
			attribSpec.instanceDivisor		= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(instanceDivisors), DE_ARRAY_END(instanceDivisors), instanceDivisorWeights);
			attribSpec.useDefaultAttribute	= random.getBool();

			// check spec is legal
			valid = attribSpec.valid(spec.apiType);

			// we do not want interleaved elements. (Might result in some weird floating point values)
			if (attribSpec.stride && attribSpec.componentCount * gls::DrawTestSpec::inputTypeSize(attribSpec.inputType) > attribSpec.stride)
				valid = false;

			// try again if not valid
			if (valid)
			{
				spec.attribs.push_back(attribSpec);
				++attrNdx;
			}
		}

		// Do not collapse all vertex positions to a single positions
		if (spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
			spec.attribs[0].instanceDivisor = 0;

		// Is render result meaningful?
		{
			// Only one vertex
			if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED && spec.indexMin == spec.indexMax && spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
				continue;
			if (spec.attribs[0].useDefaultAttribute && spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
				continue;

			// Triangle only on one axis
			if (spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLES || spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN || spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP)
			{
				if (spec.attribs[0].componentCount == 1)
					continue;
				if (spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_FLOAT || spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_INT || spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_UINT)
					continue;
				if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED && (spec.indexMax - spec.indexMin) < 2)
					continue;
			}
		}

		// Add case
		{
			deUint32 hash = spec.hash();
			for (int attrNdx = 0; attrNdx < attributeCount; ++attrNdx)
				hash = (hash << 2) ^ (deUint32)spec.attribs[attrNdx].hash();

			if (insertedHashes.find(hash) == insertedHashes.end())
			{
				// Only aligned cases
				if (spec.isCompatibilityTest() != gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET &&
					spec.isCompatibilityTest() != gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE)
					this->addChild(new gls::DrawTest(m_testCtx, m_context.getRenderContext(), spec, de::toString(insertedCount).c_str(), spec.getDesc().c_str()));
				insertedHashes.insert(hash);

				++insertedCount;
			}
		}
	}
}